

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O3

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryManager::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryManager *this,
          VkDeviceSize Size,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,bool HostVisible,
          VkMemoryAllocateFlags AllocateFlags)

{
  atomic<long> *paVar1;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  iterator iVar7;
  ulong uVar8;
  char (*Args_1) [112];
  undefined8 uVar9;
  size_type sVar10;
  undefined4 in_register_00000084;
  char *Args_2;
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  page_it;
  VkDeviceSize VVar11;
  VulkanMemoryManager *pVVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>_>
  pVar13;
  MemorySizeFormatter<unsigned_long> *Args_9;
  uint32_t MemoryTypeIndex_local;
  VulkanMemoryManager *local_1a8;
  VulkanMemoryAllocation *local_1a0;
  VkDeviceSize local_198;
  VkDeviceSize local_190;
  MemoryPageIndex PageIdx;
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  local_168;
  ulong local_160;
  char local_158 [8];
  undefined8 local_150;
  string _msg;
  unsigned_long local_48;
  char local_40 [8];
  char local_38 [8];
  
  Args_2 = (char *)CONCAT44(in_register_00000084,MemoryTypeIndex);
  __return_storage_ptr__->Page = (VulkanMemoryPage *)0x0;
  __return_storage_ptr__->UnalignedOffset = 0;
  __return_storage_ptr__->Size = 0;
  PageIdx.AllocateFlags = AllocateFlags;
  MemoryTypeIndex_local = MemoryTypeIndex;
  local_1a0 = __return_storage_ptr__;
  PageIdx.MemoryTypeIndex = MemoryTypeIndex;
  PageIdx.IsHostVisible = HostVisible;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PagesMtx);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_1a8 = this;
  pVar13 = std::
           _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range(&(this->m_Pages)._M_h,&PageIdx);
  local_198 = Alignment;
  local_190 = Size;
  if ((__node_type *)
      pVar13.first.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ._M_cur !=
      pVar13.second.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ._M_cur.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
     ) {
    do {
      local_168 = pVar13.second.
                  super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                  ._M_cur;
      VulkanMemoryPage::Allocate
                ((VulkanMemoryAllocation *)&_msg,
                 (VulkanMemoryPage *)
                 ((long)pVar13.first.
                        super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                 + 0x18),local_190,local_198);
      uVar9 = _msg.field_2._M_allocated_capacity;
      sVar10 = _msg._M_string_length;
      _Var3 = _msg._M_dataplus;
      local_1a0->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
      local_1a0->UnalignedOffset = _msg._M_string_length;
      local_1a0->Size = _msg.field_2._M_allocated_capacity;
      _msg._M_dataplus._M_p = (pointer)0x0;
      _msg._M_string_length = 0;
      _msg.field_2._M_allocated_capacity = 0;
      VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
      VVar11 = local_198;
      if (_Var3._M_p != (pointer)0x0) goto LAB_00273277;
      _Var2._M_cur = *pVar13.first.
                      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ;
      pVar13.second.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ._M_cur = local_168.
                super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                ._M_cur;
      pVar13.first.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                 )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                   )_Var2._M_cur;
    } while ((_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
              )_Var2._M_cur !=
             local_168.
             super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
             ._M_cur);
  }
  pVVar12 = local_1a8;
  uVar8 = *(VkDeviceSize *)((long)(&local_1a8->m_CurrUsedSize + -2) + (ulong)HostVisible * 8);
  do {
    uVar5 = uVar8;
    uVar8 = uVar5 * 2;
  } while (uVar5 < local_190);
  uVar6 = (local_1a8->m_CurrAllocatedSize)._M_elems[HostVisible] + uVar5;
  (local_1a8->m_CurrAllocatedSize)._M_elems[HostVisible] = uVar6;
  uVar8 = (local_1a8->m_PeakAllocatedSize)._M_elems[HostVisible];
  if (uVar6 < uVar8) {
    uVar6 = uVar8;
  }
  (local_1a8->m_PeakAllocatedSize)._M_elems[HostVisible] = uVar6;
  VulkanMemoryPage::VulkanMemoryPage
            ((VulkanMemoryPage *)&_msg,local_1a8,uVar5,MemoryTypeIndex_local,HostVisible,
             AllocateFlags);
  iVar7 = std::
          _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>,std::__detail::_Select1st,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::
          _M_emplace<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex&,VulkanUtilities::VulkanMemoryPage>
                    ((_Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>,std::__detail::_Select1st,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&this->m_Pages,0,&PageIdx,&_msg);
  Args_9 = (MemorySizeFormatter<unsigned_long> *)0x2730ef;
  VulkanMemoryPage::~VulkanMemoryPage((VulkanMemoryPage *)&_msg);
  Args_2 = "device-local";
  if (HostVisible) {
    Args_2 = "host-visible";
  }
  local_158[0] = '\x02';
  local_158[1] = '\0';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_150 = 0;
  local_48 = (pVVar12->m_CurrAllocatedSize)._M_elems[HostVisible];
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_160 = uVar5;
  Diligent::
  FormatString<char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&pVVar12->m_MgrName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\': created new "
             ,(char (*) [16])Args_2,(char (*) [13])" page. (",(char (*) [9])&local_160,
             (MemorySizeFormatter<unsigned_long> *)", type idx: ",
             (char (*) [13])&MemoryTypeIndex_local,(uint *)"). Current allocated size: ",
             (char (*) [28])&local_48,Args_9);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    Args_2 = (char *)0x0;
    (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_msg._M_dataplus._M_p != &_msg.field_2) {
    operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
  }
  (**pVVar12->_vptr_VulkanMemoryManager)
            (pVVar12,(VulkanMemoryPage *)
                     ((long)iVar7.
                            super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                            ._M_cur + 0x18));
  VVar11 = local_198;
  VulkanMemoryPage::Allocate
            ((VulkanMemoryAllocation *)&_msg,
             (VulkanMemoryPage *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                    ._M_cur + 0x18),local_190,local_198);
  uVar9 = _msg.field_2._M_allocated_capacity;
  sVar10 = _msg._M_string_length;
  _Var3 = _msg._M_dataplus;
  local_1a0->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
  local_1a0->UnalignedOffset = _msg._M_string_length;
  local_1a0->Size = _msg.field_2._M_allocated_capacity;
  _msg._M_dataplus._M_p = (pointer)0x0;
  _msg._M_string_length = 0;
  _msg.field_2._M_allocated_capacity = 0;
  VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
  if (_Var3._M_p == (pointer)0x0) {
    Diligent::FormatString<char[35]>(&_msg,(char (*) [35])"Failed to allocate new memory page");
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,199);
    pVVar12 = local_1a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p == &_msg.field_2) goto LAB_0027336e;
  }
  else {
LAB_00273277:
    Args_1 = (char (*) [112])(VVar11 ^ (ulong)(VVar11 - 1));
    local_160 = VVar11;
    if (Args_1 <= (char (*) [112])(VVar11 - 1)) {
      Diligent::FormatString<char[12],unsigned_long,char[23]>
                (&_msg,(Diligent *)"Alignment (",(char (*) [12])&local_160,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2);
      Args_1 = (char (*) [112])0x34;
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
    pVVar12 = local_1a8;
    if ((local_190 - sVar10) + (-local_160 & (local_160 - 1) + sVar10) <= (ulong)uVar9)
    goto LAB_0027336e;
    Diligent::FormatString<char[26],char[112]>
              (&_msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size"
               ,Args_1);
    pVVar12 = local_1a8;
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0xcc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p == &_msg.field_2) goto LAB_0027336e;
  }
  operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
LAB_0027336e:
  LOCK();
  paVar1 = (pVVar12->m_CurrUsedSize)._M_elems + HostVisible;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + uVar9;
  UNLOCK();
  uVar8 = (pVVar12->m_CurrUsedSize)._M_elems[HostVisible].super___atomic_base<long>._M_i;
  uVar5 = (pVVar12->m_PeakUsedSize)._M_elems[HostVisible];
  if (uVar8 < uVar5) {
    uVar8 = uVar5;
  }
  (pVVar12->m_PeakUsedSize)._M_elems[HostVisible] = uVar8;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PagesMtx);
  return local_1a0;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryManager::Allocate(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, bool HostVisible, VkMemoryAllocateFlags AllocateFlags)
{
    VulkanMemoryAllocation Allocation;

    // On integrated GPUs, there is no difference between host-visible and GPU-only
    // memory, so MemoryTypeIndex is the same. As GPU-only pages do not have CPU address,
    // we need to use HostVisible flag to differentiate the two.
    // It is likely a good idea to always keep staging pages separate to reduce fragmentation
    // even though on integrated GPUs same pages can be used for both GPU-only and staging
    // allocations. Staging allocations are short-living and will be released when upload is
    // complete, while GPU-only allocations are expected to be long-living.
    MemoryPageIndex             PageIdx{MemoryTypeIndex, HostVisible, AllocateFlags};
    std::lock_guard<std::mutex> Lock{m_PagesMtx};

    auto range = m_Pages.equal_range(PageIdx);
    for (auto page_it = range.first; page_it != range.second; ++page_it)
    {
        Allocation = page_it->second.Allocate(Size, Alignment);
        if (Allocation.Page != nullptr)
            break;
    }

    size_t stat_ind = HostVisible ? 1 : 0;
    if (Allocation.Page == nullptr)
    {
        auto PageSize = HostVisible ? m_HostVisiblePageSize : m_DeviceLocalPageSize;
        while (PageSize < Size)
            PageSize *= 2;

        m_CurrAllocatedSize[stat_ind] += PageSize;
        m_PeakAllocatedSize[stat_ind] = std::max(m_PeakAllocatedSize[stat_ind], m_CurrAllocatedSize[stat_ind]);

        auto it = m_Pages.emplace(PageIdx, VulkanMemoryPage{*this, PageSize, MemoryTypeIndex, HostVisible, AllocateFlags});
        LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': created new ", (HostVisible ? "host-visible" : "device-local"),
                         " page. (", Diligent::FormatMemorySize(PageSize, 2), ", type idx: ", MemoryTypeIndex,
                         "). Current allocated size: ", Diligent::FormatMemorySize(m_CurrAllocatedSize[stat_ind], 2));
        OnNewPageCreated(it->second);
        Allocation = it->second.Allocate(Size, Alignment);
        DEV_CHECK_ERR(Allocation.Page != nullptr, "Failed to allocate new memory page");
    }

    if (Allocation.Page != nullptr)
    {
        VERIFY_EXPR(Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size);
    }

    m_CurrUsedSize[stat_ind].fetch_add(Allocation.Size);
    m_PeakUsedSize[stat_ind] = std::max(m_PeakUsedSize[stat_ind], static_cast<VkDeviceSize>(m_CurrUsedSize[stat_ind].load()));

    return Allocation;
}